

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
::_negative_positive_transpose
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
           *this,Index columnIndex)

{
  Dictionary *this_00;
  __node_base_ptr p_Var1;
  _List_node_base *p_Var2;
  uint uVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  int iVar6;
  ulong uVar7;
  Index local_30;
  uint local_2c;
  
  this_00 = &(this->super_type).indexToBar_;
  local_30 = columnIndex;
  local_2c = columnIndex;
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this_00,&local_30);
  uVar7 = (ulong)*(uint *)((long)&pmVar4->_M_node[1]._M_next + 4);
  p_Var1 = this[2].super_type.super_type.map_._M_h._M_single_bucket;
  if (uVar7 < (ulong)((long)this[2].super_type.barcode_.
                            super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next - (long)p_Var1 >> 2)) {
    *(Index *)((long)&p_Var1->_M_nxt + uVar7 * 4) = columnIndex + 1;
    *(undefined4 *)((long)&p_Var1->_M_nxt + (ulong)local_2c * 4) =
         *(undefined4 *)((long)&p_Var1->_M_nxt + (ulong)(local_2c + 1) * 4);
    *(undefined4 *)((long)&p_Var1->_M_nxt + (ulong)(local_2c + 1) * 4) = 0xffffffff;
    local_30 = local_2c;
    iVar6 = local_2c + 1;
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this_00,&local_30);
    uVar3 = local_2c;
    *(int *)&pmVar4->_M_node[1]._M_prev = iVar6;
    local_30 = local_2c + 1;
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this_00,&local_30);
    *(uint *)((long)&pmVar4->_M_node[1]._M_next + 4) = uVar3;
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this_00,&local_2c);
    local_30 = local_2c + 1;
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this_00,&local_30);
    p_Var2 = pmVar4->_M_node;
    pmVar4->_M_node = pmVar5->_M_node;
    pmVar5->_M_node = p_Var2;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

inline void RU_vine_swap<Master_matrix>::_negative_positive_transpose(Index columnIndex) 
{
  _matrix()->pivotToColumnIndex_.at(_get_birth(columnIndex)) = columnIndex + 1;
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if (_is_paired(columnIndex + 1)) {
      _matrix()->pivotToColumnIndex_.emplace(columnIndex, _matrix()->pivotToColumnIndex_.at(columnIndex + 1));
      _matrix()->pivotToColumnIndex_.erase(columnIndex + 1);
    }
  } else {
    _matrix()->pivotToColumnIndex_[columnIndex] = _matrix()->pivotToColumnIndex_[columnIndex + 1];
    _matrix()->pivotToColumnIndex_[columnIndex + 1] = Master_matrix::template get_null_value<Index>();
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _death(columnIndex) = columnIndex + 1;
    _birth(columnIndex + 1) = columnIndex;
    std::swap(RUP::indexToBar_.at(columnIndex), RUP::indexToBar_.at(columnIndex + 1));
  }
}